

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O3

void * lys_ext_instance_substmt(lys_ext_instance *ext)

{
  uint8_t uVar1;
  byte bVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  LY_ERR *pLVar6;
  
  if (ext == (lys_ext_instance *)0x0) {
switchD_00155e3a_caseD_0:
  }
  else {
    switch(ext->insubstmt) {
    case '\0':
    case '\x13':
    case '\x14':
      goto switchD_00155e3a_caseD_0;
    case '\x01':
      if (ext->parent_type == '\n') {
switchD_00156000_caseD_1:
        return *(void **)((long)ext->parent + 0x10);
      }
      break;
    case '\x02':
      if (ext->parent_type == '\t') {
LAB_00156223:
        lVar5 = *(long *)((long)ext->parent + 0x38);
LAB_0015622b:
        return *(void **)(lVar5 + (ulong)ext->insubstmt_index * 8);
      }
      if (ext->parent_type == '\x03') {
        lVar5 = *(long *)((long)ext->parent + 0x28);
        goto LAB_0015622b;
      }
      break;
    case '\x03':
      if ((ext->parent_type == '\0') && ((*(byte *)((long)ext->parent + 0x40) & 1) != 0)) {
        return *(void **)((long)ext->parent + 0xa0);
      }
      break;
    case '\x04':
      if (ext->parent_type == '\0') {
switchD_00156000_caseD_f:
        return *(void **)((long)ext->parent + 0x30);
      }
      break;
    case '\x05':
      bVar2 = ext->parent_type;
      if (bVar2 < 0xc) {
        if (bVar2 == 1) {
          pvVar4 = ext->parent;
          iVar3 = *(int *)((long)pvVar4 + 0x38);
          if (iVar3 == 2) {
            return *(void **)((long)pvVar4 + 0x70);
          }
          if ((iVar3 == 8) || (iVar3 == 4)) {
            lVar5 = *(long *)((long)pvVar4 + 0xc0);
            goto LAB_0015622b;
          }
        }
        else if (bVar2 == 2) {
          return *(void **)((long)ext->parent + 0x78);
        }
      }
      else {
        if (bVar2 == 0xc) {
          return (void *)((ulong)ext->insubstmt_index * 8 + *(long *)((long)ext->parent + 0x40));
        }
        if (bVar2 == 0xe) goto LAB_00156223;
      }
      break;
    case '\x06':
      switch(ext->parent_type) {
      case '\0':
      case '\x11':
switchD_001560e2_caseD_0:
        return *(void **)((long)ext->parent + 0x18);
      case '\x01':
      case '\x02':
      case '\x04':
      case '\x05':
      case '\x06':
      case '\a':
      case '\b':
      case '\t':
      case '\n':
      case '\f':
      case '\r':
switchD_001560e2_caseD_1:
        return *(void **)((long)ext->parent + 8);
      case '\x0f':
switchD_00156000_caseD_10:
        pvVar4 = ext->parent;
LAB_001561f2:
        return *(void **)((long)pvVar4 + 0x28);
      case '\x10':
switchD_00156000_caseD_0:
        return *(void **)((long)ext->parent + 0x20);
      }
      break;
    case '\a':
      if (ext->parent_type == '\a') goto switchD_001560e2_caseD_0;
      break;
    case '\b':
      if (ext->parent_type == '\a') goto switchD_00156000_caseD_0;
      break;
    case '\t':
      if ((ext->parent_type == '\x01') &&
         (pvVar4 = ext->parent, *(int *)((long)pvVar4 + 0x38) == 0x10)) {
LAB_00155ee2:
        return *(void **)((long)pvVar4 + 0x80);
      }
      break;
    case '\n':
      if ((ext->parent_type == '\0') && ((*(byte *)((long)ext->parent + 0x40) & 1) == 0)) {
        return *(void **)((long)ext->parent + 0xa8);
      }
      break;
    case '\v':
      if (ext->parent_type == '\0') goto switchD_00156000_caseD_10;
      break;
    case '\f':
      if ((ext->parent_type == '\x03') && (pvVar4 = ext->parent, *(int *)((long)pvVar4 + 8) == 9))
      goto LAB_001561f2;
      break;
    case '\r':
      if (ext->parent_type == '\x0f') goto switchD_001560e2_caseD_1;
      if (ext->parent_type == '\0') goto switchD_00156000_caseD_1;
      break;
    case '\x0e':
      if (ext->parent_type == '\f') {
        return *(void **)((long)ext->parent + 0x48);
      }
      if ((ext->parent_type == '\x01') && (pvVar4 = ext->parent, *(int *)((long)pvVar4 + 0x38) == 1)
         ) goto LAB_00155ee2;
      break;
    case '\x0f':
      switch(ext->parent_type) {
      case '\0':
      case '\x11':
        goto switchD_00156000_caseD_0;
      case '\x01':
      case '\x02':
      case '\x04':
      case '\x05':
      case '\x06':
      case '\a':
      case '\b':
      case '\t':
      case '\n':
      case '\f':
      case '\r':
        goto switchD_00156000_caseD_1;
      case '\x0f':
        goto switchD_00156000_caseD_f;
      case '\x10':
        goto switchD_00156000_caseD_10;
      }
      break;
    case '\x10':
      if (ext->parent_type == '\x10') {
        return (void *)((long)ext->parent + 8);
      }
      if (ext->parent_type == '\x0f') {
        return (void *)((long)ext->parent + 0x10);
      }
      break;
    case '\x11':
      uVar1 = ext->parent_type;
      if (uVar1 == '\x0e') goto switchD_00156000_caseD_f;
      if (uVar1 == '\x02') goto switchD_00156000_caseD_10;
      if ((uVar1 == '\x01') && ((*(byte *)((long)ext->parent + 0x38) & 0xc) != 0)) {
        return *(void **)((long)ext->parent + 0xb8);
      }
      break;
    case '\x12':
      if (ext->parent_type == '\x05') {
LAB_001560fb:
        return (void *)((long)ext->parent + 0x1c);
      }
      break;
    case '\x15':
      if (ext->parent_type == '\x03') {
        pvVar4 = ext->parent;
        if (*(int *)((long)pvVar4 + 8) == 8) {
          return (void *)((long)pvVar4 + 0x28);
        }
        if (*(int *)((long)pvVar4 + 8) == 9) {
          return (void *)((long)pvVar4 + 0x38);
        }
      }
      break;
    case '\x16':
      if (ext->parent_type == '\n') {
LAB_001561e1:
        pvVar4 = ext->parent;
LAB_001561e5:
        return (void *)((long)pvVar4 + 0x18);
      }
      break;
    case '\x17':
    case '\x18':
      uVar1 = ext->parent_type;
      if (uVar1 == '\x0e') {
        return (void *)((long)ext->parent + 4);
      }
      if ((uVar1 == '\f') || (uVar1 == '\x01')) goto LAB_001561e1;
      break;
    case '\x19':
      if ((ext->parent_type == '\x01') &&
         (pvVar4 = ext->parent, (*(byte *)((long)pvVar4 + 0x38) & 0x18) != 0)) goto LAB_001561e5;
      break;
    case '\x1a':
      if ((ext->parent_type < 0xb) && ((0x676U >> (ext->parent_type & 0x1f) & 1) != 0))
      goto LAB_001561e1;
      break;
    case '\x1b':
      if ((ext->parent_type == '\x03') && (*(int *)((long)ext->parent + 8) == 4)) {
        return (void *)((long)ext->parent + 0x30);
      }
      break;
    case '\x1c':
      if (ext->parent_type == '\f') {
        return (void *)((long)ext->parent + 0x4c);
      }
      if (ext->parent_type == '\x01') {
        pvVar4 = ext->parent;
        if (*(int *)((long)pvVar4 + 0x38) == 8) {
          return (void *)((long)pvVar4 + 0xcc);
        }
        if (*(int *)((long)pvVar4 + 0x38) == 0x10) {
          return (void *)((long)pvVar4 + 0x94);
        }
      }
      break;
    case '\x1d':
      if (ext->parent_type == '\f') {
        return (void *)((long)ext->parent + 0x48);
      }
      if (ext->parent_type == '\x01') {
        pvVar4 = ext->parent;
        if (*(int *)((long)pvVar4 + 0x38) == 8) {
          return (void *)((long)pvVar4 + 200);
        }
        if (*(int *)((long)pvVar4 + 0x38) == 0x10) {
          return (void *)((long)pvVar4 + 0x90);
        }
      }
      break;
    case '\x1e':
      if (ext->parent_type == '\x04') goto LAB_001560fb;
      break;
    case '\x1f':
      if (ext->parent_type == '\x01') {
        if (*(int *)((long)ext->parent + 0x38) == 0x10) {
          return (void *)((ulong)ext->insubstmt_index * 0x10 + *(long *)((long)ext->parent + 0x88));
        }
      }
      else if (ext->parent_type == '\x0e') {
        return (void *)((ulong)ext->insubstmt_index * 0x10 + *(long *)((long)ext->parent + 0x20));
      }
    }
    pLVar6 = ly_errno_location();
    *pLVar6 = LY_EINT;
    ly_log(LY_LLERR,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_schema.c"
           ,0x75d);
  }
  return (void *)0x0;
}

Assistant:

API const void *
lys_ext_instance_substmt(const struct lys_ext_instance *ext)
{
    if (!ext) {
        return NULL;
    }

    switch (ext->insubstmt) {
    case LYEXT_SUBSTMT_SELF:
    case LYEXT_SUBSTMT_MODIFIER:
    case LYEXT_SUBSTMT_VERSION:
        return NULL;
    case LYEXT_SUBSTMT_ARGUMENT:
        if (ext->parent_type == LYEXT_PAR_EXT) {
            return ((struct lys_ext_instance*)ext->parent)->arg_value;
        }
        break;
    case LYEXT_SUBSTMT_BASE:
        if (ext->parent_type == LYEXT_PAR_TYPE) {
            return ((struct lys_type*)ext->parent)->info.ident.ref[ext->insubstmt_index];
        } else if (ext->parent_type == LYEXT_PAR_IDENT) {
            return ((struct lys_ident*)ext->parent)->base[ext->insubstmt_index];
        }
        break;
    case LYEXT_SUBSTMT_BELONGSTO:
        if (ext->parent_type == LYEXT_PAR_MODULE && ((struct lys_module*)ext->parent)->type) {
            return ((struct lys_submodule*)ext->parent)->belongsto;
        }
        break;
    case LYEXT_SUBSTMT_CONFIG:
    case LYEXT_SUBSTMT_MANDATORY:
        if (ext->parent_type == LYEXT_PAR_NODE) {
            return &((struct lys_node*)ext->parent)->flags;
        } else if (ext->parent_type == LYEXT_PAR_DEVIATE) {
            return &((struct lys_deviate*)ext->parent)->flags;
        } else if (ext->parent_type == LYEXT_PAR_REFINE) {
            return &((struct lys_refine*)ext->parent)->flags;
        }
        break;
    case LYEXT_SUBSTMT_CONTACT:
        if (ext->parent_type == LYEXT_PAR_MODULE) {
            return ((struct lys_module*)ext->parent)->contact;
        }
        break;
    case LYEXT_SUBSTMT_DEFAULT:
        if (ext->parent_type == LYEXT_PAR_NODE) {
            switch (((struct lys_node*)ext->parent)->nodetype) {
            case LYS_LEAF:
            case LYS_LEAFLIST:
                /* in case of leaf, the index is supposed to be 0, so it will return the
                 * correct pointer despite the leaf structure does not have dflt as array */
                return ((struct lys_node_leaflist*)ext->parent)->dflt[ext->insubstmt_index];
            case LYS_CHOICE:
                return ((struct lys_node_choice*)ext->parent)->dflt;
            default:
                /* internal error */
                break;
            }
        } else if (ext->parent_type == LYEXT_PAR_TPDF) {
            return ((struct lys_tpdf*)ext->parent)->dflt;
        } else if (ext->parent_type == LYEXT_PAR_DEVIATE) {
            return ((struct lys_deviate*)ext->parent)->dflt[ext->insubstmt_index];
        } else if (ext->parent_type == LYEXT_PAR_REFINE) {
            return &((struct lys_refine*)ext->parent)->dflt[ext->insubstmt_index];
        }
        break;
    case LYEXT_SUBSTMT_DESCRIPTION:
        switch (ext->parent_type) {
        case LYEXT_PAR_NODE:
            return ((struct lys_node*)ext->parent)->dsc;
        case LYEXT_PAR_MODULE:
            return ((struct lys_module*)ext->parent)->dsc;
        case LYEXT_PAR_IMPORT:
            return ((struct lys_import*)ext->parent)->dsc;
        case LYEXT_PAR_INCLUDE:
            return ((struct lys_include*)ext->parent)->dsc;
        case LYEXT_PAR_EXT:
            return ((struct lys_ext*)ext->parent)->dsc;
        case LYEXT_PAR_FEATURE:
            return ((struct lys_feature*)ext->parent)->dsc;
        case LYEXT_PAR_TPDF:
            return ((struct lys_tpdf*)ext->parent)->dsc;
        case LYEXT_PAR_TYPE_BIT:
            return ((struct lys_type_bit*)ext->parent)->dsc;
        case LYEXT_PAR_TYPE_ENUM:
            return ((struct lys_type_enum*)ext->parent)->dsc;
        case LYEXT_PAR_RESTR:
            return ((struct lys_restr*)ext->parent)->dsc;
        case LYEXT_PAR_WHEN:
            return ((struct lys_when*)ext->parent)->dsc;
        case LYEXT_PAR_IDENT:
            return ((struct lys_ident*)ext->parent)->dsc;
        case LYEXT_PAR_DEVIATION:
            return ((struct lys_deviation*)ext->parent)->dsc;
        case LYEXT_PAR_REVISION:
            return ((struct lys_revision*)ext->parent)->dsc;
        case LYEXT_PAR_REFINE:
            return ((struct lys_refine*)ext->parent)->dsc;
        default:
            break;
        }
        break;
    case LYEXT_SUBSTMT_ERRTAG:
        if (ext->parent_type == LYEXT_PAR_RESTR) {
            return ((struct lys_restr*)ext->parent)->eapptag;
        }
        break;
    case LYEXT_SUBSTMT_ERRMSG:
        if (ext->parent_type == LYEXT_PAR_RESTR) {
            return ((struct lys_restr*)ext->parent)->emsg;
        }
        break;
    case LYEXT_SUBSTMT_DIGITS:
        if (ext->parent_type == LYEXT_PAR_TYPE && ((struct lys_type*)ext->parent)->base == LY_TYPE_DEC64) {
            return &((struct lys_type*)ext->parent)->info.dec64.dig;
        }
        break;
    case LYEXT_SUBSTMT_KEY:
        if (ext->parent_type == LYEXT_PAR_NODE && ((struct lys_node*)ext->parent)->nodetype == LYS_LIST) {
            return ((struct lys_node_list*)ext->parent)->keys;
        }
        break;
    case LYEXT_SUBSTMT_MAX:
        if (ext->parent_type == LYEXT_PAR_NODE) {
            if (((struct lys_node*)ext->parent)->nodetype == LYS_LIST) {
                return &((struct lys_node_list*)ext->parent)->max;
            } else if (((struct lys_node*)ext->parent)->nodetype == LYS_LEAFLIST) {
                return &((struct lys_node_leaflist*)ext->parent)->max;
            }
        } else if (ext->parent_type == LYEXT_PAR_REFINE) {
            return &((struct lys_refine*)ext->parent)->mod.list.max;
        }
        break;
    case LYEXT_SUBSTMT_MIN:
        if (ext->parent_type == LYEXT_PAR_NODE) {
            if (((struct lys_node*)ext->parent)->nodetype == LYS_LIST) {
                return &((struct lys_node_list*)ext->parent)->min;
            } else if (((struct lys_node*)ext->parent)->nodetype == LYS_LEAFLIST) {
                return &((struct lys_node_leaflist*)ext->parent)->min;
            }
        } else if (ext->parent_type == LYEXT_PAR_REFINE) {
            return &((struct lys_refine*)ext->parent)->mod.list.min;
        }
        break;
    case LYEXT_SUBSTMT_NAMESPACE:
        if (ext->parent_type == LYEXT_PAR_MODULE && !((struct lys_module*)ext->parent)->type) {
            return ((struct lys_module*)ext->parent)->ns;
        }
        break;
    case LYEXT_SUBSTMT_ORDEREDBY:
        if (ext->parent_type == LYEXT_PAR_NODE &&
                (((struct lys_node*)ext->parent)->nodetype & (LYS_LIST | LYS_LEAFLIST))) {
            return &((struct lys_node_list*)ext->parent)->flags;
        }
        break;
    case LYEXT_SUBSTMT_ORGANIZATION:
        if (ext->parent_type == LYEXT_PAR_MODULE) {
            return ((struct lys_module*)ext->parent)->org;
        }
        break;
    case LYEXT_SUBSTMT_PATH:
        if (ext->parent_type == LYEXT_PAR_TYPE && ((struct lys_type*)ext->parent)->base == LY_TYPE_LEAFREF) {
            return ((struct lys_type*)ext->parent)->info.lref.path;
        }
        break;
    case LYEXT_SUBSTMT_POSITION:
        if (ext->parent_type == LYEXT_PAR_TYPE_BIT) {
            return &((struct lys_type_bit*)ext->parent)->pos;
        }
        break;
    case LYEXT_SUBSTMT_PREFIX:
        if (ext->parent_type == LYEXT_PAR_MODULE) {
            /* covers also lys_submodule */
            return ((struct lys_module*)ext->parent)->prefix;
        } else if (ext->parent_type == LYEXT_PAR_IMPORT) {
            return ((struct lys_import*)ext->parent)->prefix;
        }
        break;
    case LYEXT_SUBSTMT_PRESENCE:
        if (ext->parent_type == LYEXT_PAR_NODE && ((struct lys_node*)ext->parent)->nodetype == LYS_CONTAINER) {
            return ((struct lys_node_container*)ext->parent)->presence;
        } else if (ext->parent_type == LYEXT_PAR_REFINE) {
            return ((struct lys_refine*)ext->parent)->mod.presence;
        }
        break;
    case LYEXT_SUBSTMT_REFERENCE:
        switch (ext->parent_type) {
        case LYEXT_PAR_NODE:
            return ((struct lys_node*)ext->parent)->ref;
        case LYEXT_PAR_MODULE:
            return ((struct lys_module*)ext->parent)->ref;
        case LYEXT_PAR_IMPORT:
            return ((struct lys_import*)ext->parent)->ref;
        case LYEXT_PAR_INCLUDE:
            return ((struct lys_include*)ext->parent)->ref;
        case LYEXT_PAR_EXT:
            return ((struct lys_ext*)ext->parent)->ref;
        case LYEXT_PAR_FEATURE:
            return ((struct lys_feature*)ext->parent)->ref;
        case LYEXT_PAR_TPDF:
            return ((struct lys_tpdf*)ext->parent)->ref;
        case LYEXT_PAR_TYPE_BIT:
            return ((struct lys_type_bit*)ext->parent)->ref;
        case LYEXT_PAR_TYPE_ENUM:
            return ((struct lys_type_enum*)ext->parent)->ref;
        case LYEXT_PAR_RESTR:
            return ((struct lys_restr*)ext->parent)->ref;
        case LYEXT_PAR_WHEN:
            return ((struct lys_when*)ext->parent)->ref;
        case LYEXT_PAR_IDENT:
            return ((struct lys_ident*)ext->parent)->ref;
        case LYEXT_PAR_DEVIATION:
            return ((struct lys_deviation*)ext->parent)->ref;
        case LYEXT_PAR_REVISION:
            return ((struct lys_revision*)ext->parent)->ref;
        case LYEXT_PAR_REFINE:
            return ((struct lys_refine*)ext->parent)->ref;
        default:
            break;
        }
        break;
    case LYEXT_SUBSTMT_REQINSTANCE:
        if (ext->parent_type == LYEXT_PAR_TYPE) {
            if (((struct lys_type*)ext->parent)->base == LY_TYPE_LEAFREF) {
                return &((struct lys_type*)ext->parent)->info.lref.req;
            } else if (((struct lys_type*)ext->parent)->base == LY_TYPE_INST) {
                return &((struct lys_type*)ext->parent)->info.inst.req;
            }
        }
        break;
    case LYEXT_SUBSTMT_REVISIONDATE:
        if (ext->parent_type == LYEXT_PAR_IMPORT) {
            return ((struct lys_import*)ext->parent)->rev;
        } else if (ext->parent_type == LYEXT_PAR_INCLUDE) {
            return ((struct lys_include*)ext->parent)->rev;
        }
        break;
    case LYEXT_SUBSTMT_STATUS:
        switch (ext->parent_type) {
        case LYEXT_PAR_NODE:
        case LYEXT_PAR_IDENT:
        case LYEXT_PAR_TPDF:
        case LYEXT_PAR_EXT:
        case LYEXT_PAR_FEATURE:
        case LYEXT_PAR_TYPE_ENUM:
        case LYEXT_PAR_TYPE_BIT:
            /* in all structures the flags member is at the same offset */
            return &((struct lys_node*)ext->parent)->flags;
        default:
            break;
        }
        break;
    case LYEXT_SUBSTMT_UNIQUE:
        if (ext->parent_type == LYEXT_PAR_DEVIATE) {
            return &((struct lys_deviate*)ext->parent)->unique[ext->insubstmt_index];
        } else if (ext->parent_type == LYEXT_PAR_NODE && ((struct lys_node*)ext->parent)->nodetype == LYS_LIST) {
            return &((struct lys_node_list*)ext->parent)->unique[ext->insubstmt_index];
        }
        break;
    case LYEXT_SUBSTMT_UNITS:
        if (ext->parent_type == LYEXT_PAR_NODE &&
                (((struct lys_node*)ext->parent)->nodetype & (LYS_LEAF | LYS_LEAFLIST))) {
            /* units is at the same offset in both lys_node_leaf and lys_node_leaflist */
            return ((struct lys_node_leaf*)ext->parent)->units;
        } else if (ext->parent_type == LYEXT_PAR_TPDF) {
            return ((struct lys_tpdf*)ext->parent)->units;
        } else if (ext->parent_type == LYEXT_PAR_DEVIATE) {
            return ((struct lys_deviate*)ext->parent)->units;
        }
        break;
    case LYEXT_SUBSTMT_VALUE:
        if (ext->parent_type == LYEXT_PAR_TYPE_ENUM) {
            return &((struct lys_type_enum*)ext->parent)->value;
        }
        break;
    case LYEXT_SUBSTMT_YINELEM:
        if (ext->parent_type == LYEXT_PAR_EXT) {
            return &((struct lys_ext*)ext->parent)->flags;
        }
        break;
    }
    LOGINT;
    return NULL;
}